

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psa_crypto.c
# Opt level: O1

psa_status_t
psa_mac_setup(psa_mac_operation_t *operation,psa_key_handle_t handle,psa_algorithm_t alg,int is_sign
             )

{
  bool bVar1;
  byte bVar2;
  uint8_t uVar3;
  psa_status_t pVar4;
  int iVar5;
  psa_status_t pVar6;
  mbedtls_cipher_info_t *cipher_info;
  uint uVar7;
  ulong key_bits;
  psa_key_slot_t *slot;
  psa_key_slot_t *local_38;
  
  if (operation->alg != 0) {
    return -0x89;
  }
  uVar7 = alg & 0xffffc0ff;
  operation->alg = uVar7;
  bVar2 = operation->field_0x4 & 0xe0;
  operation->field_0x4 = bVar2;
  if (uVar7 == 0x2c00002) {
    operation->field_0x4 = bVar2;
    mbedtls_cipher_init(&(operation->ctx).cmac);
LAB_001123b7:
    iVar5 = 0;
    bVar1 = true;
  }
  else {
    if ((alg & 0x7fc00000) == 0x2800000) {
      (operation->ctx).dummy = 0;
      goto LAB_001123b7;
    }
    iVar5 = ((alg & 0x7f000000) == 0x2000000) - 0x87;
    bVar1 = false;
  }
  if (!bVar1) {
    memset(operation,0,0x168);
  }
  if (iVar5 != 0) {
    return iVar5;
  }
  if (is_sign != 0) {
    operation->field_0x4 = operation->field_0x4 | 0x10;
  }
  pVar4 = psa_get_key_from_slot(handle,&local_38,(uint)(is_sign == 0) * 0x400 + 0x400,alg);
  if (pVar4 != 0) goto LAB_00112432;
  if (uVar7 == 0x2c00002) {
    key_bits = (ulong)(local_38->attr).bits;
    cipher_info = mbedtls_cipher_info_from_psa
                            (0x2c00002,(local_38->attr).type,key_bits,(mbedtls_cipher_id_t *)0x0);
    if (cipher_info == (mbedtls_cipher_info_t *)0x0) {
      pVar4 = -0x86;
      goto LAB_00112432;
    }
    operation->mac_size = (uint8_t)cipher_info->block_size;
    iVar5 = psa_cmac_setup(operation,key_bits,local_38,cipher_info);
    pVar6 = mbedtls_to_psa_error(iVar5);
  }
  else {
    pVar6 = -0x86;
    if ((alg & 0x7fc00000) == 0x2800000) {
      uVar7 = (alg & 0xff) - 1;
      if (((byte)uVar7 < 0x12) && ((0x39f9fU >> (uVar7 & 0x1f) & 1) != 0)) {
        uVar3 = (&DAT_0013e3ed)[uVar7 & 0xff];
      }
      else {
        uVar3 = ((alg & 0xff) == 0x13) << 6;
      }
      operation->mac_size = uVar3;
      if (uVar3 == '\0') {
        pVar6 = -0x86;
LAB_00112536:
        bVar1 = false;
      }
      else {
        if ((local_38->attr).type != 0x1100) {
          pVar6 = -0x87;
          goto LAB_00112536;
        }
        pVar6 = psa_hmac_setup_internal
                          (&(operation->ctx).hmac,(local_38->data).raw.data,
                           (local_38->data).raw.bytes,alg & 0xff | 0x1000000);
        bVar1 = true;
      }
      pVar4 = pVar6;
      if (!bVar1) goto LAB_00112432;
    }
  }
  uVar7 = alg >> 8 & 0x3f;
  pVar4 = pVar6;
  if (((uVar7 != 0) && (pVar4 = -0x86, 3 < uVar7)) && (pVar4 = -0x87, uVar7 <= operation->mac_size))
  {
    operation->mac_size = (byte)(alg >> 8) & 0x3f;
    pVar4 = pVar6;
  }
LAB_00112432:
  if (pVar4 == 0) {
    operation->field_0x4 = operation->field_0x4 | 1;
  }
  else {
    psa_mac_abort(operation);
  }
  return pVar4;
}

Assistant:

static psa_status_t psa_mac_setup( psa_mac_operation_t *operation,
                                   psa_key_handle_t handle,
                                   psa_algorithm_t alg,
                                   int is_sign )
{
    psa_status_t status;
    psa_key_slot_t *slot;
    size_t key_bits;
    psa_key_usage_t usage =
        is_sign ? PSA_KEY_USAGE_SIGN_HASH : PSA_KEY_USAGE_VERIFY_HASH;
    uint8_t truncated = PSA_MAC_TRUNCATED_LENGTH( alg );
    psa_algorithm_t full_length_alg = PSA_ALG_FULL_LENGTH_MAC( alg );

    /* A context must be freshly initialized before it can be set up. */
    if( operation->alg != 0 )
    {
        return( PSA_ERROR_BAD_STATE );
    }

    status = psa_mac_init( operation, full_length_alg );
    if( status != PSA_SUCCESS )
        return( status );
    if( is_sign )
        operation->is_sign = 1;

    status = psa_get_transparent_key( handle, &slot, usage, alg );
    if( status != PSA_SUCCESS )
        goto exit;
    key_bits = psa_get_key_slot_bits( slot );

#if defined(MBEDTLS_CMAC_C)
    if( full_length_alg == PSA_ALG_CMAC )
    {
        const mbedtls_cipher_info_t *cipher_info =
            mbedtls_cipher_info_from_psa( full_length_alg,
                                          slot->attr.type, key_bits, NULL );
        int ret = MBEDTLS_ERR_ERROR_CORRUPTION_DETECTED;
        if( cipher_info == NULL )
        {
            status = PSA_ERROR_NOT_SUPPORTED;
            goto exit;
        }
        operation->mac_size = cipher_info->block_size;
        ret = psa_cmac_setup( operation, key_bits, slot, cipher_info );
        status = mbedtls_to_psa_error( ret );
    }
    else
#endif /* MBEDTLS_CMAC_C */
#if defined(MBEDTLS_MD_C)
    if( PSA_ALG_IS_HMAC( full_length_alg ) )
    {
        psa_algorithm_t hash_alg = PSA_ALG_HMAC_GET_HASH( alg );
        if( hash_alg == 0 )
        {
            status = PSA_ERROR_NOT_SUPPORTED;
            goto exit;
        }

        operation->mac_size = PSA_HASH_SIZE( hash_alg );
        /* Sanity check. This shouldn't fail on a valid configuration. */
        if( operation->mac_size == 0 ||
            operation->mac_size > sizeof( operation->ctx.hmac.opad ) )
        {
            status = PSA_ERROR_NOT_SUPPORTED;
            goto exit;
        }

        if( slot->attr.type != PSA_KEY_TYPE_HMAC )
        {
            status = PSA_ERROR_INVALID_ARGUMENT;
            goto exit;
        }

        status = psa_hmac_setup_internal( &operation->ctx.hmac,
                                          slot->data.raw.data,
                                          slot->data.raw.bytes,
                                          hash_alg );
    }
    else
#endif /* MBEDTLS_MD_C */
    {
        (void) key_bits;
        status = PSA_ERROR_NOT_SUPPORTED;
    }

    if( truncated == 0 )
    {
        /* The "normal" case: untruncated algorithm. Nothing to do. */
    }
    else if( truncated < 4 )
    {
        /* A very short MAC is too short for security since it can be
         * brute-forced. Ancient protocols with 32-bit MACs do exist,
         * so we make this our minimum, even though 32 bits is still
         * too small for security. */
        status = PSA_ERROR_NOT_SUPPORTED;
    }
    else if( truncated > operation->mac_size )
    {
        /* It's impossible to "truncate" to a larger length. */
        status = PSA_ERROR_INVALID_ARGUMENT;
    }
    else
        operation->mac_size = truncated;

exit:
    if( status != PSA_SUCCESS )
    {
        psa_mac_abort( operation );
    }
    else
    {
        operation->key_set = 1;
    }
    return( status );
}